

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdAddPsbtTxOutWithScript
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,
              char *redeem_script,char *descriptor,uint32_t *index)

{
  NetType_conflict type;
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  reference object;
  char *__lhs;
  char *in_RCX;
  int64_t in_RDX;
  string *in_RSI;
  Amount *in_R8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_R9;
  uint32_t *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list_1;
  string err_msg_4;
  string err_msg_3;
  Script temp_script_1;
  Script temp_wsh_script;
  Script temp_sh_script;
  string err_msg_2;
  Script temp_script;
  Address addr_1;
  AddressFactory factory;
  string err_msg_1;
  string err_msg;
  value_type ref;
  Address addr;
  Script temp_redeem_script;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  Descriptor desc;
  uint32_t txout_index;
  Script redeem_script_obj;
  Script script;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  NetType in_stack_ffffffffffffe6fc;
  DescriptorScriptReference *in_stack_ffffffffffffe700;
  AddressFactory *in_stack_ffffffffffffe708;
  string *in_stack_ffffffffffffe710;
  string *psVar4;
  CfdError in_stack_ffffffffffffe71c;
  CfdException *in_stack_ffffffffffffe720;
  Psbt *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffe748;
  byte local_1855;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_ffffffffffffe7b0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_00;
  Script *in_stack_ffffffffffffe7b8;
  Script *redeem_script_00;
  undefined7 in_stack_ffffffffffffe7c0;
  Amount *in_stack_ffffffffffffe7c8;
  Psbt *in_stack_ffffffffffffe7d0;
  allocator *address;
  undefined1 local_17d1 [33];
  CfdSourceLocation local_17b0;
  Amount local_1798;
  Amount local_1788;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1778;
  undefined1 local_1759;
  CfdSourceLocation local_1738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1719;
  undefined1 local_16f1;
  CfdSourceLocation local_16d0;
  allocator local_16b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b0;
  ByteData160 local_1690;
  Address local_1678;
  Address local_1500;
  Script local_1388;
  Script local_1350;
  Script local_1318;
  Address local_12e0;
  undefined1 local_1161;
  CfdSourceLocation local_1140;
  allocator local_1121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1120;
  Script local_1100;
  Address local_10c8;
  Amount local_f28;
  undefined1 local_f11;
  CfdSourceLocation local_ef0;
  allocator local_ed1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  undefined1 local_ea9;
  CfdSourceLocation local_e88;
  allocator local_e69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  byte local_e41;
  Script local_e40;
  Script local_e08;
  DescriptorScriptReference local_dd0;
  Script local_a80;
  Address local_a48;
  DescriptorScriptReference local_8d0;
  Address local_580;
  Script local_408;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_3d0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_3b8 [2];
  Script local_381 [7];
  undefined1 local_1f1 [129];
  Script local_170;
  uint32_t local_134;
  Script local_130;
  Script local_f8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  string *local_80;
  allocator local_71;
  string local_70 [52];
  undefined4 local_3c;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_38;
  Amount *local_30;
  char *local_28;
  int64_t local_20;
  string *local_18;
  int local_4;
  
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  address = &local_71;
  psVar4 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"PsbtHandle",address);
  cfd::capi::CheckBuffer(address,psVar4);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_80 = local_18;
  if (*(long *)((long)&local_18->field_2 + 8) == 0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x536;
    local_98.funcname = "CfdAddPsbtTxOutWithScript";
    cfd::core::logger::warn<>(&local_98,"psbt is null.");
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to handle statement. psbt is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710);
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Script::Script(&local_f8);
  cfd::core::Script::Script(&local_130);
  local_134 = 0;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1f1 + 0x61),local_28,(allocator *)((long)local_1f1 + 0x60));
    cfd::core::Script::Script(&local_170,(string *)(local_1f1 + 0x61));
    cfd::core::Script::operator=(&local_f8,&local_170);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
    std::__cxx11::string::~string((string *)(local_1f1 + 0x61));
    std::allocator<char>::~allocator((allocator<char> *)((long)local_1f1 + 0x60));
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_30);
  if (!bVar1) {
    in_stack_ffffffffffffe7d0 = (Psbt *)local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)((long)local_1f1 + 1),(char *)local_30,
               (allocator *)in_stack_ffffffffffffe7d0);
    cfd::core::Script::Script((Script *)((long)local_1f1 + 0x21),(string *)((long)local_1f1 + 1));
    cfd::core::Script::operator=(&local_130,(Script *)((long)local_1f1 + 0x21));
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
    std::__cxx11::string::~string((string *)((long)local_1f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    in_stack_ffffffffffffe7c8 = local_30;
  }
  uVar2 = cfd::capi::IsEmptyString((char *)local_38);
  if ((bool)uVar2) {
    bVar1 = cfd::core::Script::IsEmpty(&local_130);
    if ((bVar1) || (bVar1 = cfd::core::Script::IsEmpty(&local_f8), bVar1)) {
      bVar1 = cfd::core::Script::IsEmpty(&local_f8);
      if (bVar1) {
        local_17b0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        local_17b0.filename = local_17b0.filename + 1;
        local_17b0.line = 0x594;
        local_17b0.funcname = "CfdAddPsbtTxOutWithScript";
        cfd::core::logger::warn<>(&local_17b0,"locking_script is null or empty.");
        uVar3 = __cxa_allocate_exception(0x30);
        psVar4 = (string *)local_17d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_17d1 + 1),
                   "Failed to parameter. locking_script is null or empty.",(allocator *)psVar4);
        cfd::core::CfdException::CfdException
                  (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,psVar4);
        __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      this = *(Psbt **)((long)&local_80->field_2 + 8);
      cfd::core::Amount::Amount(&local_1798,local_20);
      local_134 = cfd::core::Psbt::AddTxOut(this,&local_f8,&local_1798);
    }
    else {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)in_stack_ffffffffffffe700,in_stack_ffffffffffffe6fc);
      cfd::core::Address::Address(&local_10c8);
      bVar1 = cfd::core::Script::IsP2wshScript(&local_f8);
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_1100,&local_130);
        bVar1 = cfd::core::Script::Equals(&local_1100,&local_f8);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1120,"locking_script is not match redeem_script.",&local_1121)
          ;
          std::allocator<char>::~allocator((allocator<char> *)&local_1121);
          local_1140.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                       ,0x2f);
          local_1140.filename = local_1140.filename + 1;
          local_1140.line = 0x56d;
          local_1140.funcname = "CfdAddPsbtTxOutWithScript";
          cfd::core::logger::warn<std::__cxx11::string&>(&local_1140,"{}",&local_1120);
          local_1161 = 1;
          uVar3 = __cxa_allocate_exception(0x30);
          std::operator+(in_stack_ffffffffffffe748,in_stack_ffffffffffffe740);
          cfd::core::CfdException::CfdException
                    (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710);
          local_1161 = 0;
          __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
        cfd::AddressFactory::CreateP2wshAddress
                  (in_stack_ffffffffffffe708,(Script *)in_stack_ffffffffffffe700);
        cfd::core::Address::operator=(&local_10c8,&local_12e0);
        cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
        cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
      }
      else {
        bVar1 = cfd::core::Script::IsP2shScript(&local_f8);
        if (!bVar1) {
          __rhs = &local_1719;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1719.field_0x1,"locking_script is not support format.",
                     (allocator *)__rhs);
          std::allocator<char>::~allocator((allocator<char> *)&local_1719);
          local_1738.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                       ,0x2f);
          local_1738.filename = local_1738.filename + 1;
          local_1738.line = 0x589;
          local_1738.funcname = "CfdAddPsbtTxOutWithScript";
          cfd::core::logger::warn<std::__cxx11::string&>
                    (&local_1738,"{}",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1719.field_0x1);
          local_1759 = 1;
          uVar3 = __cxa_allocate_exception(0x30);
          std::operator+(in_stack_ffffffffffffe748,__rhs);
          cfd::core::CfdException::CfdException
                    (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710);
          local_1759 = 0;
          __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
        cfd::core::ScriptUtil::CreateP2shLockingScript(&local_1318,&local_130);
        cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_1350,&local_130);
        cfd::core::ScriptUtil::CreateP2shLockingScript(&local_1388,&local_1350);
        bVar1 = cfd::core::Script::Equals(&local_1318,&local_f8);
        if (bVar1) {
          cfd::AddressFactory::CreateP2shAddress
                    (in_stack_ffffffffffffe708,(Script *)in_stack_ffffffffffffe700);
          cfd::core::Address::operator=(&local_10c8,&local_1500);
          cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
        }
        else {
          bVar1 = cfd::core::Script::Equals(&local_1388,&local_f8);
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_16b0,"locking_script is not match redeem_script.",
                       &local_16b1);
            std::allocator<char>::~allocator((allocator<char> *)&local_16b1);
            local_16d0.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                         ,0x2f);
            local_16d0.filename = local_16d0.filename + 1;
            local_16d0.line = 0x582;
            local_16d0.funcname = "CfdAddPsbtTxOutWithScript";
            cfd::core::logger::warn<std::__cxx11::string&>(&local_16d0,"{}",&local_16b0);
            local_16f1 = 1;
            __lhs = (char *)__cxa_allocate_exception(0x30);
            std::operator+(__lhs,in_stack_ffffffffffffe740);
            cfd::core::CfdException::CfdException
                      (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710
                      );
            local_16f1 = 0;
            __cxa_throw(__lhs,&cfd::core::CfdException::typeinfo,
                        cfd::core::CfdException::~CfdException);
          }
          type = *(NetType_conflict *)&local_80->field_2;
          cfd::core::HashUtil::Hash160(&local_1690,&local_1350);
          cfd::core::Address::Address(&local_1678,type,kP2shP2wshAddress,&local_1690);
          cfd::core::Address::operator=(&local_10c8,&local_1678);
          cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
          cfd::core::ByteData160::~ByteData160((ByteData160 *)0x5f51c4);
        }
        cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
        cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
        cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
      }
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_1778);
      cfd::core::Amount::Amount(&local_1788,local_20);
      local_134 = cfd::Psbt::AddTxOutData
                            (in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
                             (Address *)CONCAT17(uVar2,in_stack_ffffffffffffe7c0),
                             in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7b0);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                 in_stack_ffffffffffffe710);
      cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x5f563e);
    }
  }
  else {
    redeem_script_00 = local_381;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)((long)&local_381[0]._vptr_Script + 1),(char *)local_38,
               (allocator *)redeem_script_00);
    cfd::core::Descriptor::Parse
              ((Descriptor *)
               ((long)&local_381[0].script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1),
               (string *)((long)&local_381[0]._vptr_Script + 1),
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    std::__cxx11::string::~string((string *)((long)&local_381[0]._vptr_Script + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_381);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x5f4380);
    cfd::core::Descriptor::GetKeyDataAll
              (local_3b8,
               (Descriptor *)
               ((long)&local_381[0].script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Descriptor::GetReferenceAll
              (&local_3d0,
               (Descriptor *)
               ((long)&local_381[0].script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Script::Script(&local_408);
    cfd::core::Address::Address(&local_580);
    object = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::front((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      *)in_stack_ffffffffffffe700);
    cfd::core::DescriptorScriptReference::DescriptorScriptReference(&local_8d0,object);
    cfd::core::DescriptorScriptReference::GenerateAddress
              (&local_a48,&local_8d0,*(NetType *)&local_80->field_2);
    cfd::core::Address::operator=(&local_580,&local_a48);
    cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
    key_list_00 = local_38;
    while (bVar1 = cfd::core::DescriptorScriptReference::HasChild(&local_8d0), bVar1) {
      bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(&local_8d0);
      if (bVar1) {
        cfd::core::DescriptorScriptReference::GetRedeemScript(&local_a80,&local_8d0);
        cfd::core::Script::operator=(&local_408,&local_a80);
        cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
      }
      cfd::core::DescriptorScriptReference::GetChild(&local_dd0,&local_8d0);
      cfd::core::DescriptorScriptReference::operator=(&local_8d0,&local_dd0);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffe700);
    }
    bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript(&local_8d0);
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetRedeemScript(&local_e08,&local_8d0);
      cfd::core::Script::operator=(&local_408,&local_e08);
      cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
    }
    local_e41 = 0;
    bVar1 = cfd::core::Script::IsEmpty(&local_f8);
    local_1855 = 0;
    if (!bVar1) {
      cfd::core::DescriptorScriptReference::GetLockingScript(&local_e40,&local_8d0);
      local_e41 = 1;
      bVar1 = cfd::core::Script::Equals(&local_f8,&local_e40);
      local_1855 = bVar1 ^ 0xff;
    }
    if ((local_e41 & 1) != 0) {
      cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
    }
    if ((local_1855 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e68,"locking_script doesn\'t match the descriptor.",&local_e69);
      std::allocator<char>::~allocator((allocator<char> *)&local_e69);
      local_e88.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_e88.filename = local_e88.filename + 1;
      local_e88.line = 0x555;
      local_e88.funcname = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::warn<std::__cxx11::string&>(&local_e88,"{}",&local_e68);
      local_ea9 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::operator+(in_stack_ffffffffffffe748,in_stack_ffffffffffffe740);
      cfd::core::CfdException::CfdException
                (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710);
      local_ea9 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    bVar1 = cfd::core::Script::IsEmpty(&local_130);
    if ((!bVar1) && (bVar1 = cfd::core::Script::Equals(&local_130,&local_408), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_ed0,"redeem_script doesn\'t match the descriptor.",&local_ed1);
      std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
      local_ef0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_ef0.filename = local_ef0.filename + 1;
      local_ef0.line = 0x55d;
      local_ef0.funcname = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::warn<std::__cxx11::string&>(&local_ef0,"{}",&local_ed0);
      local_f11 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::operator+(in_stack_ffffffffffffe748,in_stack_ffffffffffffe740);
      cfd::core::CfdException::CfdException
                (in_stack_ffffffffffffe720,in_stack_ffffffffffffe71c,in_stack_ffffffffffffe710);
      local_f11 = 0;
      __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::Amount::Amount(&local_f28,local_20);
    local_134 = cfd::Psbt::AddTxOutData
                          (in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,
                           (Address *)CONCAT17(uVar2,in_stack_ffffffffffffe7c0),redeem_script_00,
                           key_list_00);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffe700);
    cfd::core::Address::~Address((Address *)in_stack_ffffffffffffe700);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::~vector(&local_3d0);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffe710);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffe710);
    cfd::core::Descriptor::~Descriptor((Descriptor *)0x5f4c41);
  }
  if (in_stack_00000008 != (uint32_t *)0x0) {
    *in_stack_00000008 = local_134;
  }
  local_4 = 0;
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffe700);
  return local_4;
}

Assistant:

int CfdAddPsbtTxOutWithScript(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* redeem_script,
    const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    Script redeem_script_obj;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) script = Script(locking_script);
    if (!IsEmptyString(redeem_script)) {
      redeem_script_obj = Script(redeem_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key_list = desc.GetKeyDataAll();
      auto ref_list = desc.GetReferenceAll();
      Script temp_redeem_script;
      Address addr;
      auto ref = ref_list.front();
      addr = ref.GenerateAddress(psbt_obj->net_type);
      while (ref.HasChild()) {
        if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();
        ref = ref.GetChild();
      }
      if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();

      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      if ((!redeem_script_obj.IsEmpty()) &&
          (!redeem_script_obj.Equals(temp_redeem_script))) {
        std::string err_msg = "redeem_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, temp_redeem_script, key_list);
    } else if ((!redeem_script_obj.IsEmpty()) && (!script.IsEmpty())) {
      AddressFactory factory(psbt_obj->net_type);
      Address addr;
      if (script.IsP2wshScript()) {
        auto temp_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        if (!temp_script.Equals(script)) {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
        addr = factory.CreateP2wshAddress(redeem_script_obj);
      } else if (script.IsP2shScript()) {
        auto temp_sh_script =
            ScriptUtil::CreateP2shLockingScript(redeem_script_obj);
        auto temp_wsh_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        auto temp_script =
            ScriptUtil::CreateP2shLockingScript(temp_wsh_script);
        if (temp_sh_script.Equals(script)) {
          addr = factory.CreateP2shAddress(redeem_script_obj);
        } else if (temp_script.Equals(script)) {
          addr = Address(
              psbt_obj->net_type, AddressType::kP2shP2wshAddress,
              HashUtil::Hash160(temp_wsh_script));
        } else {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
      } else {
        std::string err_msg = "locking_script is not support format.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      std::vector<KeyData> key_list;
      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, redeem_script_obj, key_list);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}